

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall putto_reader::~putto_reader(putto_reader *this)

{
  (this->super_action)._vptr_action = (_func_int **)&PTR__putto_reader_00142190;
  std::__cxx11::string::~string((string *)&this->_loadname);
  std::__cxx11::string::~string((string *)&this->_readername);
  return;
}

Assistant:

virtual ~putto_reader() { }